

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regvalue.h
# Opt level: O0

ValueType_t RegistryValue::typestr_to_valuetype(string *typestr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  bool bVar1;
  char *__nptr;
  ulong uVar2;
  string *__return_storage_ptr__;
  undefined8 uVar3;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *typestr_local;
  
  local_18 = typestr;
  bVar1 = std::operator==(typestr,"none");
  if (bVar1) {
    typestr_local._4_4_ = 0;
  }
  else {
    bVar1 = std::operator==(local_18,"sz");
    if (bVar1) {
      typestr_local._4_4_ = 1;
    }
    else {
      bVar1 = std::operator==(local_18,"string");
      if (bVar1) {
        typestr_local._4_4_ = 1;
      }
      else {
        bVar1 = std::operator==(local_18,"expand_sz");
        if (bVar1) {
          typestr_local._4_4_ = 2;
        }
        else {
          bVar1 = std::operator==(local_18,"expandsz");
          if (bVar1) {
            typestr_local._4_4_ = 2;
          }
          else {
            bVar1 = std::operator==(local_18,"expand");
            if (bVar1) {
              typestr_local._4_4_ = 2;
            }
            else {
              bVar1 = std::operator==(local_18,"binary");
              if (bVar1) {
                typestr_local._4_4_ = 3;
              }
              else {
                bVar1 = std::operator==(local_18,"hex");
                if (bVar1) {
                  typestr_local._4_4_ = 3;
                }
                else {
                  bVar1 = std::operator==(local_18,"dword");
                  if (bVar1) {
                    typestr_local._4_4_ = 4;
                  }
                  else {
                    bVar1 = std::operator==(local_18,"dwordle");
                    if (bVar1) {
                      typestr_local._4_4_ = 4;
                    }
                    else {
                      bVar1 = std::operator==(local_18,"qword");
                      if (bVar1) {
                        typestr_local._4_4_ = 0xb;
                      }
                      else {
                        bVar1 = std::operator==(local_18,"qwordle");
                        if (bVar1) {
                          typestr_local._4_4_ = 0xb;
                        }
                        else {
                          bVar1 = std::operator==(local_18,"qword");
                          if (bVar1) {
                            typestr_local._4_4_ = 0xb;
                          }
                          else {
                            bVar1 = std::operator==(local_18,"dwordbe");
                            if (bVar1) {
                              typestr_local._4_4_ = 5;
                            }
                            else {
                              bVar1 = std::operator==(local_18,"multisz");
                              if (bVar1) {
                                typestr_local._4_4_ = 7;
                              }
                              else {
                                bVar1 = std::operator==(local_18,"multi_sz");
                                if (bVar1) {
                                  typestr_local._4_4_ = 7;
                                }
                                else {
                                  bVar1 = std::operator==(local_18,"mui_sz");
                                  if (bVar1) {
                                    typestr_local._4_4_ = 0x15;
                                  }
                                  else {
                                    bVar1 = std::operator==(local_18,"link");
                                    if (bVar1) {
                                      typestr_local._4_4_ = 6;
                                    }
                                    else {
                                      bVar1 = std::operator==(local_18,"resourcelist");
                                      if (bVar1) {
                                        typestr_local._4_4_ = 8;
                                      }
                                      else {
                                        bVar1 = std::operator==(local_18,"resource_list");
                                        if (bVar1) {
                                          typestr_local._4_4_ = 8;
                                        }
                                        else {
                                          bVar1 = std::operator==(local_18,"rl");
                                          if (bVar1) {
                                            typestr_local._4_4_ = 8;
                                          }
                                          else {
                                            bVar1 = std::operator==(local_18,
                                                  "full_resource_descriptor");
                                            if (bVar1) {
                                              typestr_local._4_4_ = 9;
                                            }
                                            else {
                                              bVar1 = std::operator==(local_18,"frd");
                                              if (bVar1) {
                                                typestr_local._4_4_ = 9;
                                              }
                                              else {
                                                bVar1 = std::operator==(local_18,
                                                  "resource_requirements_list");
                                                if (bVar1) {
                                                  typestr_local._4_4_ = 10;
                                                }
                                                else {
                                                  bVar1 = std::operator==(local_18,"rrl");
                                                  __s = local_18;
                                                  if (bVar1) {
                                                    typestr_local._4_4_ = 10;
                                                  }
                                                  else {
                                                    std::__cxx11::
                                                                                                        
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  ::basic_regex(&local_38,"^\\s*[0-9]+\\s*$",0x10);
                                                  bVar1 = std::
                                                  regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                                                            (__s,&local_38,0);
                                                  std::__cxx11::
                                                  basic_regex<char,_std::__cxx11::regex_traits<char>_>
                                                  ::~basic_regex(&local_38);
                                                  if (!bVar1) {
                                                    __return_storage_ptr__ =
                                                         (string *)__cxa_allocate_exception(0x20);
                                                    uVar3 = std::__cxx11::string::c_str();
                                                    stringformat_abi_cxx11_
                                                              (__return_storage_ptr__,
                                                               "unknown value type: %hs",uVar3);
                                                    __cxa_throw(__return_storage_ptr__,
                                                                &std::__cxx11::string::typeinfo,
                                                                std::__cxx11::string::~string);
                                                  }
                                                  __nptr = (char *)std::__cxx11::string::c_str();
                                                  uVar2 = strtoul(__nptr,(char **)0x0,0);
                                                  typestr_local._4_4_ = (ValueType_t)uVar2;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return typestr_local._4_4_;
}

Assistant:

static ValueType_t typestr_to_valuetype(const std::string& typestr)
    {
        if (typestr=="none")                       return REG_NONE;
        if (typestr=="sz")                         return REG_SZ;
        if (typestr=="string")                     return REG_SZ;
        if (typestr=="expand_sz")                  return REG_EXPAND_SZ;
        if (typestr=="expandsz")                   return REG_EXPAND_SZ;
        if (typestr=="expand")                     return REG_EXPAND_SZ;
        if (typestr=="binary")                     return REG_BINARY;
        if (typestr=="hex")                        return REG_BINARY;
        if (typestr=="dword")                      return REG_DWORD;
        if (typestr=="dwordle")                    return REG_DWORD_LITTLE_ENDIAN;
        if (typestr=="qword")                      return REG_QWORD;
        if (typestr=="qwordle")                    return REG_QWORD_LITTLE_ENDIAN;
        if (typestr=="qword")                      return REG_QWORD;
        if (typestr=="dwordbe")                    return REG_DWORD_BIG_ENDIAN;
        if (typestr=="multisz")                    return REG_MULTI_SZ;
        if (typestr=="multi_sz")                   return REG_MULTI_SZ;
        if (typestr=="mui_sz")                     return REG_MUI_SZ;
        if (typestr=="link")                       return REG_LINK;
        if (typestr=="resourcelist")               return REG_RESOURCE_LIST;
        if (typestr=="resource_list")              return REG_RESOURCE_LIST;
        if (typestr=="rl")                         return REG_RESOURCE_LIST;
        if (typestr=="full_resource_descriptor")   return REG_FULL_RESOURCE_DESCRIPTOR;
        if (typestr=="frd")                        return REG_FULL_RESOURCE_DESCRIPTOR;
        if (typestr=="resource_requirements_list") return REG_RESOURCE_REQUIREMENTS_LIST;
        if (typestr=="rrl")                        return REG_RESOURCE_REQUIREMENTS_LIST;

        if (REGEX_MATCH(typestr, CHARREGEX("^\\s*[0-9]+\\s*$")))
            return strtoul(typestr.c_str(), 0, 0);

        throw stringformat("unknown value type: %hs", typestr.c_str());

    }